

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O1

Raster * rw::xbox_to_d3d(Raster *ras)

{
  bool bVar1;
  int iVar2;
  Raster *raster;
  void *texels;
  int32 dxt;
  long lVar3;
  int32 level;
  
  lVar3 = (long)xbox::nativeRasterOffset;
  bVar1 = true;
  dxt = 0;
  if (*(char *)((long)&ras->height + lVar3 + 1) == '\x01') {
    iVar2 = *(int *)((long)&ras->format + lVar3);
    if (iVar2 == 0xf) {
      dxt = 5;
    }
    else if (iVar2 == 0xe) {
      dxt = 3;
    }
    else {
      dxt = 0;
      if (iVar2 != 0xc) goto LAB_00110fa2;
      dxt = 1;
    }
    bVar1 = false;
  }
LAB_00110fa2:
  if (bVar1) {
    raster = (Raster *)0x0;
  }
  else {
    level = 0;
    raster = Raster::create(ras->width,ras->height,ras->depth,ras->format | 0x84,0);
    iVar2 = (**(code **)(*(long *)(engine + 0x58 + (long)ras->platform * 8) + 0x38))(ras);
    d3d::allocateDXT(raster,dxt,iVar2,(uint)*(byte *)((long)&ras->height + lVar3));
    if (0 < iVar2) {
      do {
        texels = (void *)(**(code **)(*(long *)(engine + 0x58 + (long)ras->platform * 8) + 0x18))
                                   (ras,level,2);
        d3d::setTexels(raster,texels,level);
        (**(code **)(*(long *)(engine + 0x58 + (long)ras->platform * 8) + 0x20))(ras,level);
        level = level + 1;
      } while (iVar2 != level);
    }
  }
  return raster;
}

Assistant:

static rw::Raster*
xbox_to_d3d(rw::Raster *ras)
{
	using namespace rw;

	int dxt = 0;
	xbox::XboxRaster *xboxras = GETXBOXRASTEREXT(ras);
	if(xboxras->customFormat){
		switch(xboxras->format){
		case xbox::D3DFMT_DXT1: dxt = 1; break;
		case xbox::D3DFMT_DXT3: dxt = 3; break;
		case xbox::D3DFMT_DXT5: dxt = 5; break;
		}
	}
	if(dxt == 0)
		return nil;

	Raster *newras = Raster::create(ras->width, ras->height, ras->depth,
		                        ras->format | Raster::TEXTURE | Raster::DONTALLOCATE);
	int numLevels = ras->getNumLevels();
	d3d::allocateDXT(newras, dxt, numLevels, xboxras->hasAlpha);
	for(int i = 0; i < numLevels; i++){
		uint8 *srcpx = ras->lock(i, Raster::LOCKREAD);
	//	uint8 *dstpx = newras->lock(i, Raster::LOCKWRITE | Raster::LOCKNOFETCH);
		d3d::setTexels(newras, srcpx, i);
	//	flipDXT(dxt, dstpx, srcpx, ras->width, ras->height);
		ras->unlock(i);
	//	newras->unlock(i);
	}

	return newras;
}